

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newpfor.h
# Opt level: O3

void __thiscall
FastPForLib::NewPFor<4U,_FastPForLib::Simple16<false>_>::encodeBlock
          (NewPFor<4U,_FastPForLib::Simple16<false>_> *this,uint32_t *in,uint32_t *out,
          size_t *nvalue)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer puVar4;
  sbyte sVar5;
  int iVar6;
  uint32_t i_1;
  uint bit;
  ulong uVar7;
  ulong uVar8;
  uint32_t i;
  uint32_t uVar9;
  long lVar10;
  uint32_t *puVar11;
  int iVar12;
  ulong uVar13;
  uint32_t *puVar14;
  size_t encodedExceptions_sz;
  size_t local_38;
  
  bit = (*(this->super_IntegerCODEC)._vptr_IntegerCODEC[9])(this,in,0x80);
  if (bit < 0x20) {
    local_38 = 0;
    lVar10 = 0;
    sVar5 = ((byte)bit < 0x21) * (' ' - (byte)bit);
    puVar2 = (this->tobecoded).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->exceptionsPositions).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = (this->exceptionsValues).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      uVar1 = in[lVar10];
      if (uVar1 < (uint)(1 << (bit & 0x1f))) {
        puVar2[lVar10] = uVar1;
        uVar13 = uVar8;
      }
      else {
        puVar2[lVar10] = uVar1 & (uint)(-1 << sVar5) >> sVar5;
        puVar3[uVar8] = (uint)lVar10;
        uVar13 = (ulong)((int)uVar8 + 1);
        puVar4[uVar8] = in[lVar10] >> (bit & 0x1f);
      }
      lVar10 = lVar10 + 1;
      uVar8 = uVar13;
    } while (lVar10 != 0x80);
    iVar12 = (int)uVar13;
    if (iVar12 == 0) {
      uVar8 = 0;
    }
    else {
      if (iVar12 - 1U != 0) {
        uVar8 = (ulong)(iVar12 - 1U);
        do {
          uVar7 = uVar8 - 1;
          puVar3[uVar8] = puVar3[uVar8] - puVar3[uVar7 & 0xffffffff];
          uVar8 = uVar7;
        } while ((int)uVar7 != 0);
      }
      puVar11 = (this->exceptionsPositions).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar14 = (this->exceptions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar8 = 0;
      do {
        if (uVar8 == 0) {
          uVar9 = *puVar11;
        }
        else {
          uVar9 = puVar11[uVar8] - 1;
        }
        puVar14[uVar8] = uVar9;
        iVar6 = (int)uVar8;
        puVar2 = puVar4 + uVar8;
        uVar8 = uVar8 + 1;
        puVar14[(uint)(iVar12 + iVar6)] = *puVar2 - 1;
      } while (uVar13 != uVar8);
      Simple16<false>::encodeArray
                (&this->ecoder,puVar14,(ulong)(uint)(iVar12 * 2),out + 1,&local_38);
      uVar8 = local_38 & 0xffffffff;
    }
    lVar10 = 0;
    puVar11 = out + uVar8 + 1;
    *out = (uint)uVar8 | iVar12 << 0x10 | bit << 0x1a;
    uVar8 = 0xffffffffffffffe0;
    puVar14 = puVar11;
    do {
      fastpackwithoutmask((uint32_t *)
                          ((long)(this->tobecoded).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + lVar10),puVar11,bit);
      uVar8 = uVar8 + 0x20;
      lVar10 = lVar10 + 0x80;
      puVar11 = puVar11 + bit;
      puVar14 = puVar14 + bit;
    } while (uVar8 < 0x60);
    *nvalue = (long)puVar14 - (long)out >> 2;
  }
  else {
    lVar10 = 0;
    *out = bit << 0x1a;
    do {
      out[lVar10 + 1] = in[lVar10];
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x80);
    *nvalue = 0x81;
  }
  return;
}

Assistant:

void NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::encodeBlock(
    const uint32_t *in, uint32_t *out, size_t &nvalue) {
  const uint32_t len = BlockSize;

  uint32_t b = findBestB(in, len);
  if (b < 32) {

    uint32_t nExceptions = 0;
    size_t encodedExceptions_sz = 0;

    const uint32_t *const initout(out);
    for (uint32_t i = 0; i < len; i++) {

      if (in[i] >= (1U << b)) {
        tobecoded[i] = in[i] & ((1U << b) - 1);
        exceptionsPositions[nExceptions] = i;
        exceptionsValues[nExceptions] = (in[i] >> b);
        nExceptions++;
      } else {
        tobecoded[i] = in[i];
      }
    }

    if (nExceptions > 0) {

      for (uint32_t i = nExceptions - 1; i > 0; i--) {
        const uint32_t cur = exceptionsPositions[i];
        const uint32_t prev = exceptionsPositions[i - 1];

        exceptionsPositions[i] = cur - prev;
      }

      for (uint32_t i = 0; i < nExceptions; i++) {

        exceptions[i] =
            (i > 0) ? exceptionsPositions[i] - 1 : exceptionsPositions[i];
        exceptions[i + nExceptions] = exceptionsValues[i] - 1;
      }
    }

    if (nExceptions > 0)
      ecoder.encodeArray(&exceptions[0], 2 * nExceptions, out + 1,
                         encodedExceptions_sz);
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ)) |
             (nExceptions << PFORDELTA_EXCEPTSZ) |
             static_cast<uint32_t>(encodedExceptions_sz);
    /* Write exceptional values */

    out += static_cast<uint32_t>(encodedExceptions_sz);
    for (uint32_t i = 0; i < len; i += 32) {
      fastpackwithoutmask(&tobecoded[i], out, b);
      out += b;
    }
    nvalue = out - initout;

  } else {
    *out++ = (b << (PFORDELTA_NEXCEPT + PFORDELTA_EXCEPTSZ));
    for (uint32_t i = 0; i < len; i++)
      out[i] = in[i];
    nvalue = len + 1;
  }
}